

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderOperatorTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Performance::anon_unknown_1::OperatorPerformanceCase::render
          (OperatorPerformanceCase *this,int numDrawCalls)

{
  RenderContext *context;
  int iVar1;
  undefined4 extraout_var;
  Surface local_68;
  PixelBufferAccess local_50;
  int local_28;
  int local_24;
  int callNdx;
  int numVertices;
  Functions *gl;
  OperatorPerformanceCase *pOStack_10;
  int numDrawCalls_local;
  OperatorPerformanceCase *this_local;
  
  gl._4_4_ = numDrawCalls;
  pOStack_10 = this;
  iVar1 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  _callNdx = CONCAT44(extraout_var,iVar1);
  local_24 = getNumVertices(this->m_gridSizeX,this->m_gridSizeY);
  for (local_28 = 0; local_28 < gl._4_4_; local_28 = local_28 + 1) {
    (**(code **)(_callNdx + 0x538))(4,0,local_24);
  }
  context = this->m_renderCtx;
  tcu::Surface::Surface(&local_68,1,1);
  tcu::Surface::getAccess(&local_50,&local_68);
  glu::readPixels(context,0,0,&local_50);
  tcu::Surface::~Surface(&local_68);
  return;
}

Assistant:

void OperatorPerformanceCase::render (int numDrawCalls)
{
	const glw::Functions&	gl				= m_renderCtx.getFunctions();
	const int				numVertices		= getNumVertices(m_gridSizeX, m_gridSizeY);

	for (int callNdx = 0; callNdx < numDrawCalls; callNdx++)
		gl.drawArrays(GL_TRIANGLES, 0, numVertices);

	glu::readPixels(m_renderCtx, 0, 0, tcu::Surface(1, 1).getAccess()); // \note Serves as a more reliable replacement for glFinish().
}